

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeCoordinator.cpp
# Opt level: O2

void __thiscall helics::TimeCoordinator::enterInitialization(TimeCoordinator *this)

{
  int iVar1;
  pointer pDVar2;
  DependencyInfo *dep;
  pointer pDVar3;
  ActionMessage timeUpdateRequest;
  
  if (this->dynamicJoining == true) {
    ActionMessage::ActionMessage(&timeUpdateRequest,cmd_request_current_time);
    timeUpdateRequest.source_id.gid = (this->super_BaseTimeCoordinator).mSourceId.gid;
    pDVar2 = (this->super_BaseTimeCoordinator).dependencies.dependencies.
             super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    for (pDVar3 = (this->super_BaseTimeCoordinator).dependencies.dependencies.
                  super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>
                  ._M_impl.super__Vector_impl_data._M_start; pDVar3 != pDVar2; pDVar3 = pDVar3 + 1)
    {
      if ((pDVar3->dependency == true) &&
         (iVar1 = (pDVar3->fedID).gid, iVar1 != (this->super_BaseTimeCoordinator).mSourceId.gid)) {
        timeUpdateRequest.dest_id.gid = iVar1;
        std::function<void_(const_helics::ActionMessage_&)>::operator()
                  (&(this->super_BaseTimeCoordinator).sendMessageFunction,&timeUpdateRequest);
      }
    }
    ActionMessage::~ActionMessage(&timeUpdateRequest);
  }
  return;
}

Assistant:

void TimeCoordinator::enterInitialization()
{
    if (dynamicJoining) {
        ActionMessage timeUpdateRequest(CMD_REQUEST_CURRENT_TIME);
        timeUpdateRequest.source_id = mSourceId;
        for (const auto& dep : dependencies) {
            // send to all dependencies
            if (dep.dependency) {
                if (dep.fedID == mSourceId) {
                    continue;
                }
                timeUpdateRequest.dest_id = dep.fedID;
                sendMessageFunction(timeUpdateRequest);
            }
        }
    }
}